

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.h
# Opt level: O0

void __thiscall
GlobOpt::
TrackByteCodeUsesForInstrAddedInOptInstr<GlobOpt::CopyPropReplaceOpnd(IR::Instr*,IR::Opnd*,StackSym*,IR::IndirOpnd*)::__0>
          (GlobOpt *this,Instr *trackByteCodeUseOnInstr,anon_class_24_3_cd72d7c2 fn)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  JitArenaAllocator *pJVar2;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BVSparse<Memory::JitArenaAllocator> *currentBytecodeUsesBeforeOpt;
  TrackAllocData local_60;
  BVSparse<Memory::JitArenaAllocator> *local_38;
  BVSparse<Memory::JitArenaAllocator> *tempByteCodeUse;
  PropertySym *tempPropertySymUse;
  PropertySym *currentPropertySymUse;
  BVSparse<Memory::JitArenaAllocator> *currentBytecodeUses;
  Instr *trackByteCodeUseOnInstr_local;
  GlobOpt *this_local;
  
  currentPropertySymUse = (PropertySym *)this->byteCodeUses;
  tempPropertySymUse = this->propertySymUse;
  tempByteCodeUse = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  pJVar2 = this->tempAlloc;
  currentBytecodeUses = (BVSparse<Memory::JitArenaAllocator> *)trackByteCodeUseOnInstr;
  trackByteCodeUseOnInstr_local = (Instr *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.h"
             ,0x345);
  pJVar2 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar2,&local_60);
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pJVar2,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,this->tempAlloc);
  pBVar1 = this->byteCodeUsesBeforeOpt;
  this->byteCodeUsesBeforeOpt = this_00;
  this->propertySymUse = (PropertySym *)0x0;
  local_38 = this_00;
  TrackByteCodeSymUsed((Instr *)currentBytecodeUses,this_00,(PropertySym **)&tempByteCodeUse);
  CopyPropReplaceOpnd::anon_class_24_3_cd72d7c2::operator()(&fn);
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)currentPropertySymUse;
  this->propertySymUse = tempPropertySymUse;
  this->byteCodeUsesBeforeOpt = pBVar1;
  return;
}

Assistant:

void TrackByteCodeUsesForInstrAddedInOptInstr(IR::Instr * trackByteCodeUseOnInstr, Fn fn)
    {
        BVSparse<JitArenaAllocator> *currentBytecodeUses = this->byteCodeUses;
        PropertySym * currentPropertySymUse = this->propertySymUse;
        PropertySym * tempPropertySymUse = NULL;
        this->byteCodeUses = NULL;
        BVSparse<JitArenaAllocator> *tempByteCodeUse = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
#if DBG
        BVSparse<JitArenaAllocator> *currentBytecodeUsesBeforeOpt = this->byteCodeUsesBeforeOpt;
        this->byteCodeUsesBeforeOpt = tempByteCodeUse;
#endif
        this->propertySymUse = NULL;
        GlobOpt::TrackByteCodeSymUsed(trackByteCodeUseOnInstr, tempByteCodeUse, &tempPropertySymUse);

        fn();

        this->byteCodeUses = currentBytecodeUses;
        this->propertySymUse = currentPropertySymUse;
#if DBG
        this->byteCodeUsesBeforeOpt = currentBytecodeUsesBeforeOpt;
#endif
    }